

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstExpr.h
# Opt level: O1

String * __thiscall
nigel::AstVariable::modelString_abi_cxx11_(String *__return_storage_ptr__,AstVariable *this)

{
  undefined4 uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = *(undefined4 *)&(this->super_AstReturning).field_0x34;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(uVar1) {
  case 0:
    pcVar3 = "fast";
    pcVar2 = "";
    break;
  case 1:
    pcVar3 = "large";
    pcVar2 = "";
    break;
  case 2:
    pcVar3 = "stack";
    pcVar2 = "";
    break;
  case 3:
    pcVar3 = "heap";
    pcVar2 = "";
    break;
  case 4:
    pcVar3 = "param";
    pcVar2 = "";
    break;
  default:
    pcVar3 = "-!-UNKNOWN-!-";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

String modelString()
		{
			if( model == MemModel::fast ) return "fast";
			else if( model == MemModel::large ) return "large";
			else if( model == MemModel::stack ) return "stack";
			else if( model == MemModel::heap ) return "heap";
			else if( model == MemModel::param ) return "param";
			else return "-!-UNKNOWN-!-";
		}